

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O3

void __thiscall APowerRegeneration::DoEffect(APowerRegeneration *this)

{
  bool bVar1;
  AActor *pAVar2;
  FSoundID local_14;
  
  APowerup::DoEffect(&this->super_APowerup);
  pAVar2 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
  if (pAVar2 == (AActor *)0x0) {
    return;
  }
  if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this->super_APowerup).super_AInventory.Owner.field_0.p = (AActor *)0x0;
    return;
  }
  if (pAVar2->health < 1) {
    return;
  }
  if (((byte)level.time & 0x1f) != 0) {
    return;
  }
  bVar1 = P_GiveBody(pAVar2,(int)(this->super_APowerup).Strength,0);
  if (!bVar1) {
    return;
  }
  pAVar2 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
  if (pAVar2 != (AActor *)0x0) {
    if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_00608211;
    (this->super_APowerup).super_AInventory.Owner.field_0.p = (AActor *)0x0;
  }
  pAVar2 = (AActor *)0x0;
LAB_00608211:
  S_FindSound("*regenerate");
  S_Sound(pAVar2,3,&local_14,1.0,1.0);
  return;
}

Assistant:

void APowerRegeneration::DoEffect()
{
	Super::DoEffect();
	if (Owner != NULL && Owner->health > 0 && (level.time & 31) == 0)
	{
		if (P_GiveBody(Owner, int(Strength)))
		{
			S_Sound(Owner, CHAN_ITEM, "*regenerate", 1, ATTN_NORM );
		}
	}
}